

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ListeningReporter::reportInvalidArguments(ListeningReporter *this,string *arg)

{
  pointer puVar1;
  IStreamingReporter *pIVar2;
  undefined8 extraout_RDX;
  unique_ptr<Catch::IStreamingReporter> *listener;
  pointer this_00;
  
  puVar1 = (this->m_listeners).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_listeners).
                 super__Vector_base<Catch::Detail::unique_ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Detail::unique_ptr<Catch::IStreamingReporter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pIVar2 = Detail::unique_ptr<Catch::IStreamingReporter>::operator->(this_00);
    (*pIVar2->_vptr_IStreamingReporter[3])(pIVar2,arg);
  }
  pIVar2 = Detail::unique_ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*pIVar2->_vptr_IStreamingReporter[3])
            (pIVar2,arg,extraout_RDX,pIVar2->_vptr_IStreamingReporter[3]);
  return;
}

Assistant:

void ListeningReporter::reportInvalidArguments(std::string const &arg) {
        for (auto const &listener : m_listeners) {
            listener->reportInvalidArguments(arg);
        }
        m_reporter->reportInvalidArguments(arg);
    }